

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O3

void Logger::printLine<>(char *text)

{
  char *extraout_RDX;
  string_view text_00;
  string message;
  string local_28;
  
  tinyformat::format<>(&local_28,text);
  text_00._M_str = extraout_RDX;
  text_00._M_len = (size_t)local_28._M_dataplus._M_p;
  printLine((Logger *)local_28._M_string_length,text_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void printLine(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		printLine(message);
	}